

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<int,_ProFileCache::Entry>::findImpl<int>(QHash<int,_ProFileCache::Entry> *this,int *key)

{
  ulong uVar1;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *pDVar2;
  Span *pSVar3;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *pDVar4;
  Bucket BVar5;
  iterator iVar6;
  
  pDVar2 = this->d;
  if ((pDVar2 == (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0) || (pDVar2->size == 0))
  {
    pDVar2 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
    pDVar4 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
  }
  else {
    uVar1 = (long)*key ^ pDVar2->seed;
    uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
    uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
    BVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::
            findBucketWithHash<int>(pDVar2,key,uVar1 >> 0x20 ^ uVar1);
    pDVar2 = this->d;
    pSVar3 = pDVar2->spans;
    pDVar4 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)
             (((ulong)((long)BVar5.span - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | BVar5.index);
    if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::detached(pDVar2);
      this->d = pDVar2;
      pSVar3 = pDVar2->spans;
    }
    if (pSVar3[(ulong)pDVar4 >> 7].offsets[(uint)BVar5.index & 0x7f] == 0xff) {
      pDVar2 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
      pDVar4 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0;
    }
  }
  iVar6.i.bucket = (size_t)pDVar4;
  iVar6.i.d = pDVar2;
  return (iterator)iVar6.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }